

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

int lest::repeat(text *opt,text *arg)

{
  int iVar1;
  runtime_error *this;
  runtime_error local_d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  text local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)arg);
  iVar1 = stoi(&local_40);
  std::__cxx11::string::_M_dispose();
  if (-2 < iVar1) {
    return iVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c0,"expecting \'-1\' or positive number with option \'",opt);
  std::operator+(&local_a0,&local_c0,"\', got \'");
  std::operator+(&local_80,&local_a0,arg);
  std::operator+(&local_60,&local_80,"\' (try option --help)");
  std::runtime_error::runtime_error(local_d0,(string *)&local_60);
  std::runtime_error::runtime_error(this,local_d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline int repeat( text opt, text arg )
{
    const int num = lest::stoi( arg );

    if ( indefinite( num ) || num >= 0 )
        return num;

    throw std::runtime_error( "expecting '-1' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}